

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void feintrack::copy_24to24_flip
               (uchar *dest_buf,uchar *src_buf,uint32_t src_width,uint32_t src_heght)

{
  uint uVar1;
  uchar *puVar2;
  uint32_t i;
  uint32_t uVar3;
  ulong uVar4;
  uchar *puVar5;
  
  uVar1 = src_width * 3;
  puVar2 = src_buf + uVar1 * src_heght;
  for (uVar3 = 0; uVar3 != src_heght; uVar3 = uVar3 + 1) {
    puVar2 = puVar2 + -(ulong)uVar1;
    puVar5 = puVar2;
    for (uVar4 = (ulong)uVar1; uVar4 != 0; uVar4 = uVar4 - 3) {
      *dest_buf = *puVar5;
      dest_buf[1] = puVar5[1];
      dest_buf[2] = puVar5[2];
      puVar5 = puVar5 + 3;
      dest_buf = dest_buf + 3;
    }
  }
  return;
}

Assistant:

void copy_24to24_flip(uchar* dest_buf, const uchar* src_buf, uint32_t src_width, uint32_t src_heght)
	{
        uint32_t src_pitch = 3 * src_width;
		src_buf += src_pitch * src_heght;
        const uchar* from_ptr(nullptr);
        for (uint32_t i = 0; i < src_heght; ++i)
		{
			from_ptr = src_buf - src_pitch;
			for (; from_ptr != src_buf; from_ptr += 3, dest_buf += 3)
			{
				dest_buf[0] = from_ptr[0];
				dest_buf[1] = from_ptr[1];
				dest_buf[2] = from_ptr[2];
			}
			src_buf -= src_pitch;
		}
	}